

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O2

void duckdb::ApproxCountDistinctUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  byte bVar1;
  long lVar2;
  InternalException *this;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  LogicalType local_180;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat hdata;
  Vector hash_vec;
  UnifiedVectorFormat idata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  Vector::ToUnifiedFormat(inputs,count,&idata);
  if (count < 0x801) {
    LogicalType::LogicalType(&local_180,UBIGINT);
    Vector::Vector(&hash_vec,&local_180,count);
    LogicalType::~LogicalType(&local_180);
    VectorOperations::Hash(inputs,&hash_vec,count);
    UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
    Vector::ToUnifiedFormat(state_vector,count,&sdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&hdata);
    Vector::ToUnifiedFormat(&hash_vec,count,&hdata);
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = uVar3;
      if ((idata.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(idata.sel)->sel_vector[uVar3];
      }
      if ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
           (uVar4 & 0x3f) & 1) != 0)) {
        uVar4 = uVar3;
        if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)(sdata.sel)->sel_vector[uVar3];
        }
        uVar6 = uVar3;
        if ((hdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)(hdata.sel)->sel_vector[uVar3];
        }
        uVar7 = (ulong)((uint)*(ulong *)(hdata.data + uVar6 * 8) & 0x3f);
        uVar6 = *(ulong *)(hdata.data + uVar6 * 8) >> 6 | 0x400000000000000;
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        bVar5 = (char)lVar2 + 1;
        bVar1 = *(byte *)(*(long *)(sdata.data + uVar4 * 8) + uVar7);
        if (bVar5 < bVar1) {
          bVar5 = bVar1;
        }
        *(byte *)(*(long *)(sdata.data + uVar4 * 8) + uVar7) = bVar5;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&hdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
    Vector::~Vector(&hash_vec);
    UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&hash_vec,"ApproxCountDistinct - count must be at most vector size",
             (allocator *)&sdata);
  InternalException::InternalException(this,(string *)&hash_vec);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                              Vector &state_vector, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	UnifiedVectorFormat idata;
	input.ToUnifiedFormat(count, idata);

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	const auto states = UnifiedVectorFormat::GetDataNoConst<ApproxDistinctCountState *>(sdata);

	UnifiedVectorFormat hdata;
	hash_vec.ToUnifiedFormat(count, hdata);
	const auto *hashes = UnifiedVectorFormat::GetData<hash_t>(hdata);
	for (idx_t i = 0; i < count; i++) {
		if (idata.validity.RowIsValid(idata.sel->get_index(i))) {
			auto agg_state = states[sdata.sel->get_index(i)];
			const auto hash = hashes[hdata.sel->get_index(i)];
			agg_state->hll.InsertElement(hash);
		}
	}
}